

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_attribute.c
# Opt level: O0

void prf_push_attribute_entry_f(prf_node_t *node,prf_state_t *state)

{
  long in_RSI;
  ushort *in_RDI;
  
  if (*in_RDI == prf_push_attribute_info.opcode) {
    *(short *)(in_RSI + 0x7a) = *(short *)(in_RSI + 0x7a) + 1;
  }
  else {
    prf_error(9,"tried push attribute entry state method on node of type %d.",(ulong)*in_RDI);
  }
  return;
}

Assistant:

static
void
prf_push_attribute_entry_f(
    prf_node_t * node,
    prf_state_t * state )
{
    assert( node != NULL && state != NULL );
    if ( node->opcode != prf_push_attribute_info.opcode ) {
        prf_error( 9,
            "tried push attribute entry state method on node of type %d.",
            node->opcode );
        return;
    }
    state->attribute_level++;
}